

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle-vulkan.c
# Opt level: O3

void demo_prepare(demo *demo)

{
  uint32_t *puVar1;
  VkDescriptorSetLayout *ppVVar2;
  float fVar3;
  VkSampleCountFlagBits VVar4;
  uint uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  VkPipelineDynamicStateCreateInfo *pVVar9;
  undefined4 uVar11;
  VkImage pVVar10;
  undefined4 uVar12;
  undefined4 uVar13;
  VkResult VVar14;
  VkPresentModeKHR *pVVar15;
  VkImage *ppVVar16;
  SwapchainBuffers *pSVar17;
  VkFramebuffer *ppVVar18;
  uint32_t uVar19;
  long lVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  long lVar23;
  ulong uVar24;
  bool bVar25;
  byte bVar26;
  VkImageViewCreateInfo view;
  VkSurfaceCapabilitiesKHR surfCapabilities;
  uint32_t presentModeCount;
  VkSamplerCreateInfo sampler;
  VkAttachmentReference depth_reference;
  VkPipelineInputAssemblyStateCreateInfo ia;
  VkPipelineVertexInputStateCreateInfo vi;
  VkCommandPoolCreateInfo cmd_pool_info;
  VkCommandBufferAllocateInfo cmd;
  VkDynamicState dynamicStateEnables [9];
  VkPipelineCacheCreateInfo pipelineCache;
  VkPipelineViewportStateCreateInfo vp;
  undefined1 local_3b8 [28];
  undefined4 uStack_39c;
  undefined8 local_398;
  undefined1 auStack_390 [8];
  undefined8 uStack_388;
  VkImageSubresourceRange VStack_380;
  undefined4 local_36c;
  undefined4 local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  undefined8 local_358;
  VkImageView local_350;
  undefined1 local_348 [8];
  VkExtent2D VStack_340;
  VkExtent2D local_338;
  VkExtent2D VStack_330;
  char *local_328;
  VkSubpassDescription *pVStack_320;
  undefined8 local_318;
  VkSubpassDependency *pVStack_310;
  undefined8 local_308;
  VkShaderModule pVStack_300;
  char *local_2f8;
  undefined8 uStack_2f0;
  uint32_t *local_2e0;
  VkPipelineRasterizationStateCreateInfo local_2d8;
  undefined1 local_298 [16];
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  VkSampleCountFlagBits VStack_268;
  float fStack_264;
  undefined8 uStack_260;
  undefined8 uStack_258;
  VkPipelineMultisampleStateCreateInfo *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  VkPipelineDynamicStateCreateInfo *local_238;
  VkPipelineLayout local_230;
  VkRenderPass local_228;
  VkPipelineColorBlendStateCreateInfo local_208;
  VkPipelineDynamicStateCreateInfo local_1c8;
  VkPipelineInputAssemblyStateCreateInfo local_1a8;
  VkPipelineVertexInputStateCreateInfo local_188;
  VkCommandPoolCreateInfo local_150;
  VkPipelineColorBlendAttachmentState local_138;
  VkCommandBufferAllocateInfo local_118;
  VkDynamicState local_f8 [12];
  VkPipelineCacheCreateInfo local_c8;
  VkPipelineMultisampleStateCreateInfo local_98;
  VkPipelineViewportStateCreateInfo local_68;
  
  bVar26 = 0;
  local_150.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_150.pNext = (void *)0x0;
  local_150.flags = 2;
  local_150.queueFamilyIndex = demo->graphics_queue_node_index;
  VVar14 = (*glad_vkCreateCommandPool)
                     (demo->device,&local_150,(VkAllocationCallbacks *)0x0,&demo->cmd_pool);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x5a8,"void demo_prepare(struct demo *)");
  }
  local_118.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_118.pNext = (void *)0x0;
  local_118.commandPool = demo->cmd_pool;
  local_118.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  local_118.commandBufferCount = 1;
  VVar14 = (*glad_vkAllocateCommandBuffers)(demo->device,&local_118,&demo->draw_cmd);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x5b2,"void demo_prepare(struct demo *)");
  }
  pVVar9 = (VkPipelineDynamicStateCreateInfo *)demo->swapchain;
  VVar14 = (*glad_vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
                     (demo->gpu,demo->surface,(VkSurfaceCapabilitiesKHR *)local_348);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x247,"void demo_prepare_buffers(struct demo *)");
  }
  VVar14 = (*glad_vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (demo->gpu,demo->surface,(uint32_t *)&local_2d8,(VkPresentModeKHR *)0x0);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x24c,"void demo_prepare_buffers(struct demo *)");
  }
  pVVar15 = (VkPresentModeKHR *)malloc((local_2d8._0_8_ & 0xffffffff) << 2);
  if (pVVar15 == (VkPresentModeKHR *)0x0) {
    __assert_fail("presentModes",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x24f,"void demo_prepare_buffers(struct demo *)");
  }
  VVar14 = (*glad_vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (demo->gpu,demo->surface,(uint32_t *)&local_2d8,pVVar15);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x252,"void demo_prepare_buffers(struct demo *)");
  }
  if ((float)VStack_340.width == -NAN) {
    fVar3 = (float)demo->width;
    VVar4 = demo->height;
    VStack_340.width = VStack_330.width;
    if ((uint)fVar3 < VStack_330.width) {
      VStack_340.width = (uint32_t)fVar3;
    }
    if ((uint)fVar3 < local_338.width) {
      VStack_340.width = local_338.width;
    }
    VStack_268 = local_338.height;
    if ((local_338.height <= VVar4) && (VStack_268 = VStack_330.height, VVar4 < VStack_330.height))
    {
      VStack_268 = VVar4;
    }
  }
  else {
    demo->width = VStack_340.width;
    demo->height = VStack_340.height;
    VStack_268 = VStack_340.height;
  }
  local_278._0_4_ = local_348._4_4_;
  if ((uint)local_348._0_4_ < (uint)local_348._4_4_) {
    local_278._0_4_ = local_348._0_4_;
  }
  if (local_348._4_4_ == VK_SAMPLER_ADDRESS_MODE_REPEAT) {
    local_278._0_4_ = local_348._0_4_;
  }
  local_248._0_4_ = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
  if (((ulong)local_328 & 0x100000000) == 0) {
    local_248._0_4_ = (VkSurfaceTransformFlagBitsKHR)pVStack_320;
  }
  local_298._0_4_ = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
  local_298._8_8_ = (void *)0x0;
  local_288 = (VkDescriptorSet)((ulong)local_288._4_4_ << 0x20);
  uStack_280._0_4_ = (VkFilter)demo->surface;
  uStack_280._4_4_ = (VkSamplerMipmapMode)((ulong)demo->surface >> 0x20);
  uVar6 = demo->format;
  uVar11 = demo->color_space;
  fStack_264 = 1.4013e-45;
  uStack_260._0_4_ = 0x10;
  uStack_260._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_258._0_4_ = 0.0;
  local_250 = (VkPipelineMultisampleStateCreateInfo *)0x0;
  local_248._4_4_ = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
  uStack_240._0_4_ = VK_PRESENT_MODE_FIFO_KHR;
  uStack_240._4_4_ = 1;
  local_278._4_4_ = uVar6;
  uStack_270._0_4_ = uVar11;
  uStack_270._4_4_ = (float)VStack_340.width;
  local_238 = pVVar9;
  VVar14 = (*glad_vkCreateSwapchainKHR)
                     (demo->device,(VkSwapchainCreateInfoKHR *)local_298,
                      (VkAllocationCallbacks *)0x0,&demo->swapchain);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x29e,"void demo_prepare_buffers(struct demo *)");
  }
  if (pVVar9 != (VkPipelineDynamicStateCreateInfo *)0x0) {
    (*glad_vkDestroySwapchainKHR)(demo->device,(VkSwapchainKHR)pVVar9,(VkAllocationCallbacks *)0x0);
  }
  puVar1 = &demo->swapchainImageCount;
  VVar14 = (*glad_vkGetSwapchainImagesKHR)(demo->device,demo->swapchain,puVar1,(VkImage *)0x0);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x2aa,"void demo_prepare_buffers(struct demo *)");
  }
  ppVVar16 = (VkImage *)malloc((ulong)*puVar1 << 3);
  if (ppVVar16 == (VkImage *)0x0) {
    __assert_fail("swapchainImages",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x2ae,"void demo_prepare_buffers(struct demo *)");
  }
  VVar14 = (*glad_vkGetSwapchainImagesKHR)(demo->device,demo->swapchain,puVar1,ppVVar16);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x2b2,"void demo_prepare_buffers(struct demo *)");
  }
  uVar5 = demo->swapchainImageCount;
  local_2e0 = puVar1;
  pSVar17 = (SwapchainBuffers *)malloc((ulong)uVar5 * 0x18);
  demo->buffers = pSVar17;
  if (pSVar17 == (SwapchainBuffers *)0x0) {
    __assert_fail("demo->buffers",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x2b6,"void demo_prepare_buffers(struct demo *)");
  }
  local_350 = (VkImageView)pVVar15;
  if (uVar5 != 0) {
    lVar20 = 0x10;
    uVar24 = 0;
    do {
      local_3b8._0_4_ = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
      local_3b8._8_8_ = (VkImage)0x0;
      local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
      local_398 = (VkExtent2D *)CONCAT44(demo->format,VK_IMAGE_VIEW_TYPE_2D);
      auStack_390._0_4_ = VK_COMPONENT_SWIZZLE_R;
      auStack_390._4_4_ = VK_COMPONENT_SWIZZLE_G;
      uStack_388._0_4_ = VK_COMPONENT_SWIZZLE_B;
      uStack_388._4_4_ = VK_COMPONENT_SWIZZLE_A;
      VStack_380.aspectMask = 1;
      VStack_380.baseMipLevel = 0;
      VStack_380.levelCount = 1;
      VStack_380.baseArrayLayer = 0;
      VStack_380.layerCount = 1;
      pVVar10 = ppVVar16[uVar24];
      pSVar17 = demo->buffers;
      *(VkImage *)((long)pSVar17 + lVar20 + -0x10) = pVVar10;
      local_3b8._24_4_ = SUB84(pVVar10,0);
      uStack_39c = (undefined4)((ulong)pVVar10 >> 0x20);
      VVar14 = (*glad_vkCreateImageView)
                         (demo->device,(VkImageViewCreateInfo *)local_3b8,
                          (VkAllocationCallbacks *)0x0,
                          (VkImageView *)((long)&pSVar17->image + lVar20));
      if (VVar14 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                      ,0x2d3,"void demo_prepare_buffers(struct demo *)");
      }
      uVar24 = uVar24 + 1;
      lVar20 = lVar20 + 0x18;
    } while (uVar24 < *local_2e0);
  }
  lVar20 = 0;
  demo->current_buffer = 0;
  free(local_350);
  local_298._0_4_ = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_298._8_8_ = (void *)0x0;
  local_288 = (VkDescriptorSet)0x100000000;
  uStack_280._0_4_ = 0x7c;
  uVar7 = demo->width;
  uVar12 = demo->height;
  local_278._4_4_ = VK_SHARING_MODE_CONCURRENT;
  uStack_270._0_4_ = 1;
  uStack_270._4_4_ = 1.4013e-45;
  VStack_268 = VK_SAMPLE_COUNT_1_BIT;
  fStack_264 = 0.0;
  uStack_260._0_4_ = 0x20;
  uStack_260._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_258._0_4_ = 0.0;
  local_250 = (VkPipelineMultisampleStateCreateInfo *)0x0;
  local_248._0_4_ = 0;
  local_338.width = 0;
  local_338.height = 0;
  VStack_330.width = 0;
  VStack_330.height = 0;
  local_348 = (undefined1  [8])0x5;
  VStack_340.width = 0;
  VStack_340.height = 0;
  local_3b8._8_8_ = (VkImage)0x0;
  auStack_390._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  auStack_390._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  uStack_388._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  uStack_388._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
  VStack_380.baseArrayLayer = 0;
  local_36c = 0;
  local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
  local_3b8._20_4_ = 0;
  local_3b8._24_4_ = 0;
  uStack_39c = 0;
  local_3b8._0_8_ = (VkSampler)0xf;
  local_398 = (VkExtent2D *)0x7c00000001;
  VStack_380.aspectMask = 2;
  VStack_380.baseMipLevel = 0;
  VStack_380.levelCount = 1;
  VStack_380.layerCount = 1;
  (demo->depth).format = VK_FORMAT_D16_UNORM;
  uStack_280._4_4_ = uVar7;
  local_278._0_4_ = uVar12;
  VVar14 = (*glad_vkCreateImage)
                     (demo->device,(VkImageCreateInfo *)local_298,(VkAllocationCallbacks *)0x0,
                      &(demo->depth).image);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x308,"void demo_prepare_depth(struct demo *)");
  }
  (*glad_vkGetImageMemoryRequirements)
            (demo->device,(demo->depth).image,(VkMemoryRequirements *)&local_2d8);
  local_338.width = local_2d8.sType;
  local_338.height = local_2d8._4_4_;
  if ((local_2d8.flags & 1) == 0) {
    lVar20 = 0;
    do {
      if (lVar20 == 0x1f) {
        __assert_fail("pass",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                      ,0x312,"void demo_prepare_depth(struct demo *)");
      }
      lVar20 = lVar20 + 1;
      uVar5 = local_2d8.flags & 2;
      local_2d8.flags = local_2d8.flags >> 1;
    } while (uVar5 == 0);
  }
  VStack_330.width = (uint32_t)lVar20;
  VVar14 = (*glad_vkAllocateMemory)
                     (demo->device,(VkMemoryAllocateInfo *)local_348,(VkAllocationCallbacks *)0x0,
                      &(demo->depth).mem);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x316,"void demo_prepare_depth(struct demo *)");
  }
  VVar14 = (*glad_vkBindImageMemory)(demo->device,(demo->depth).image,(demo->depth).mem,0);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x31b,"void demo_prepare_depth(struct demo *)");
  }
  demo_set_image_layout
            (demo,(demo->depth).image,2,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL,0);
  pVVar10 = (demo->depth).image;
  local_3b8._24_4_ = SUB84(pVVar10,0);
  uStack_39c = (undefined4)((ulong)pVVar10 >> 0x20);
  VVar14 = (*glad_vkCreateImageView)
                     (demo->device,(VkImageViewCreateInfo *)local_3b8,(VkAllocationCallbacks *)0x0,
                      &(demo->depth).view);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x325,"void demo_prepare_depth(struct demo *)");
  }
  local_2d8._0_8_ = &DAT_ff00ff00ffff0000;
  (*glad_vkGetPhysicalDeviceFormatProperties)
            (demo->gpu,VK_FORMAT_B8G8R8A8_UNORM,(VkFormatProperties *)local_348);
  if ((((ulong)local_348 & 1) == 0) || (demo->use_staging_buffer != false)) {
    if (((ulong)local_348 & 0x100000000) == 0) {
      __assert_fail("!\"No support for B8G8R8A8_UNORM as texture image format\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x3d4,"void demo_prepare_textures(struct demo *)");
    }
    local_398 = (VkExtent2D *)0x0;
    auStack_390._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
    auStack_390._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
    local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
    local_3b8._20_4_ = 0;
    local_3b8._24_4_ = 0;
    uStack_39c = 0;
    local_3b8._0_8_ = (VkSampler)0x0;
    local_3b8._8_8_ = (VkImage)0x0;
    demo_prepare_texture_image
              (demo,(uint32_t *)&local_2d8,(texture_object *)local_3b8,VK_IMAGE_TILING_LINEAR,1,6);
    demo_prepare_texture_image
              (demo,(uint32_t *)&local_2d8,demo->textures,VK_IMAGE_TILING_OPTIMAL,6,1);
    demo_set_image_layout
              (demo,(VkImage)local_3b8._8_8_,1,local_3b8._16_4_,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL
               ,0);
    demo_set_image_layout
              (demo,demo->textures[0].image,1,demo->textures[0].imageLayout,
               VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,0);
    local_298._0_8_ = 1;
    local_298._8_8_ = (void *)0x100000000;
    local_288 = (VkDescriptorSet)0x0;
    uStack_280._0_4_ = VK_FILTER_NEAREST;
    uStack_280._4_4_ = VK_SAMPLER_MIPMAP_MODE_LINEAR;
    local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_REPEAT;
    local_278._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
    uStack_270._0_4_ = 1;
    uStack_270._4_4_ = 0.0;
    VStack_268 = 0;
    fStack_264 = 0.0;
    uStack_260._0_4_ = auStack_390._0_4_;
    uStack_260._4_4_ = auStack_390._4_4_;
    uStack_258._0_4_ = 1.4013e-45;
    (*glad_vkCmdCopyImage)
              (demo->setup_cmd,(VkImage)local_3b8._8_8_,VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
               demo->textures[0].image,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,1,
               (VkImageCopy *)local_298);
    demo_set_image_layout
              (demo,demo->textures[0].image,1,VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,
               demo->textures[0].imageLayout,0);
    demo_flush_init_cmd(demo);
    (*glad_vkDestroyImage)(demo->device,(VkImage)local_3b8._8_8_,(VkAllocationCallbacks *)0x0);
    (*glad_vkFreeMemory)
              (demo->device,(VkDeviceMemory)CONCAT44(uStack_39c,local_3b8._24_4_),
               (VkAllocationCallbacks *)0x0);
  }
  else {
    demo_prepare_texture_image
              (demo,(uint32_t *)&local_2d8,demo->textures,VK_IMAGE_TILING_LINEAR,4,6);
  }
  local_298._8_8_ = (void *)0x0;
  VStack_268 = 0;
  uStack_260._0_4_ = 0;
  uStack_260._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_258._0_4_ = 0.0;
  uStack_258._4_4_ = 0.0;
  local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_REPEAT;
  local_278._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_270._0_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
  uStack_270._4_4_ = 0.0;
  local_288 = (VkDescriptorSet)0x0;
  uStack_280._0_4_ = VK_FILTER_NEAREST;
  uStack_280._4_4_ = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  local_298._0_8_ = 0x1f;
  fStack_264 = 1.0;
  local_250 = (VkPipelineMultisampleStateCreateInfo *)0x4;
  puVar21 = &DAT_00124f70;
  puVar22 = (undefined8 *)local_3b8;
  for (lVar20 = 10; lVar20 != 0; lVar20 = lVar20 + -1) {
    *puVar22 = *puVar21;
    puVar21 = puVar21 + (ulong)bVar26 * -2 + 1;
    puVar22 = puVar22 + (ulong)bVar26 * -2 + 1;
  }
  VVar14 = (*glad_vkCreateSampler)
                     (demo->device,(VkSamplerCreateInfo *)local_298,(VkAllocationCallbacks *)0x0,
                      &demo->textures[0].sampler);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x3fb,"void demo_prepare_textures(struct demo *)");
  }
  pVVar10 = demo->textures[0].image;
  local_3b8._24_4_ = SUB84(pVVar10,0);
  uStack_39c = (undefined4)((ulong)pVVar10 >> 0x20);
  VVar14 = (*glad_vkCreateImageView)
                     (demo->device,(VkImageViewCreateInfo *)local_3b8,(VkAllocationCallbacks *)0x0,
                      &demo->textures[0].view);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x401,"void demo_prepare_textures(struct demo *)");
  }
  local_298._8_8_ = (void *)0x0;
  local_288 = (VkDescriptorSet)0x0;
  local_278._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
  uStack_270._0_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
  uStack_270._4_4_ = 0.0;
  VStack_268 = 0;
  fStack_264 = 0.0;
  local_298._0_4_ = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  local_298._4_4_ = 0;
  uStack_280._0_4_ = 0x3c;
  uStack_280._4_4_ = VK_SAMPLER_MIPMAP_MODE_NEAREST;
  local_278._0_4_ = 0x80;
  local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
  local_3b8._20_4_ = 0;
  local_3b8._24_4_ = 0;
  uStack_39c = 0;
  local_3b8._0_8_ = (VkSampler)0x5;
  local_3b8._8_8_ = (VkImage)0x0;
  (demo->vertices).vi_attrs[1].binding = 0;
  (demo->vertices).vi_attrs[1].format = VK_FORMAT_UNDEFINED;
  *(undefined8 *)&(demo->vertices).vi_attrs[1].offset = 0;
  (demo->vertices).vi_attrs[0].binding = 0;
  (demo->vertices).vi_attrs[0].format = VK_FORMAT_UNDEFINED;
  *(undefined8 *)&(demo->vertices).vi_attrs[0].offset = 0;
  (demo->vertices).vi_bindings[0].binding = 0;
  (demo->vertices).vi_bindings[0].stride = 0;
  *(undefined8 *)&(demo->vertices).vi_bindings[0].inputRate = 0;
  *(undefined8 *)&(demo->vertices).vi.vertexAttributeDescriptionCount = 0;
  (demo->vertices).vi.pVertexAttributeDescriptions = (VkVertexInputAttributeDescription *)0x0;
  (demo->vertices).vi.flags = 0;
  (demo->vertices).vi.vertexBindingDescriptionCount = 0;
  (demo->vertices).vi.pVertexBindingDescriptions = (VkVertexInputBindingDescription *)0x0;
  *(undefined8 *)&(demo->vertices).vi = 0;
  (demo->vertices).vi.pNext = (void *)0x0;
  (demo->vertices).buf = (VkBuffer)0x0;
  (demo->vertices).mem = (VkDeviceMemory)0x0;
  VVar14 = (*glad_vkCreateBuffer)
                     (demo->device,(VkBufferCreateInfo *)local_298,(VkAllocationCallbacks *)0x0,
                      &(demo->vertices).buf);
  if (VVar14 != VK_SUCCESS) {
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x423,"void demo_prepare_vertices(struct demo *)");
  }
  (*glad_vkGetBufferMemoryRequirements)
            (demo->device,(demo->vertices).buf,(VkMemoryRequirements *)local_348);
  local_3b8._16_4_ = local_348._0_4_;
  local_3b8._20_4_ = local_348._4_4_;
  bVar25 = true;
  uVar24 = 0;
  uVar19 = local_338.width;
  while (((uVar19 & 1) == 0 ||
         ((~(demo->memory_properties).memoryTypes[uVar24].propertyFlags & 6) != 0))) {
    uVar19 = uVar19 >> 1;
    bVar25 = uVar24 < 0x1f;
    uVar24 = uVar24 + 1;
    if (uVar24 == 0x20) {
LAB_0010aa68:
      __assert_fail("pass",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x42d,"void demo_prepare_vertices(struct demo *)");
    }
  }
  local_3b8._24_4_ = (undefined4)uVar24;
  if (bVar25) {
    VVar14 = (*glad_vkAllocateMemory)
                       (demo->device,(VkMemoryAllocateInfo *)local_3b8,(VkAllocationCallbacks *)0x0,
                        &(demo->vertices).mem);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x430,"void demo_prepare_vertices(struct demo *)");
    }
    VVar14 = (*glad_vkMapMemory)(demo->device,(demo->vertices).mem,0,
                                 CONCAT44(local_3b8._20_4_,local_3b8._16_4_),0,(void **)&local_2d8);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x434,"void demo_prepare_vertices(struct demo *)");
    }
    *(undefined8 *)(local_2d8._0_8_ + 0x2c) = 0x3f8000003f800000;
    *(undefined8 *)(local_2d8._0_8_ + 0x34) = 0x3f8000003f000000;
    *(undefined8 *)(local_2d8._0_8_ + 0x20) = 0x3f800000;
    *(undefined8 *)(local_2d8._0_8_ + 0x28) = 0x3f80000000000000;
    *(undefined8 *)(local_2d8._0_8_ + 0x10) = 0x3f80000000000000;
    *(undefined8 *)(local_2d8._0_8_ + 0x18) = 0x3e800000bf800000;
    *(undefined8 *)local_2d8._0_8_ = 0xbf800000bf800000;
    *(undefined8 *)(local_2d8._0_8_ + 8) = 0x3e800000;
    (*glad_vkUnmapMemory)(demo->device,(demo->vertices).mem);
    VVar14 = (*glad_vkBindBufferMemory)(demo->device,(demo->vertices).buf,(demo->vertices).mem,0);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x43c,"void demo_prepare_vertices(struct demo *)");
    }
    (demo->vertices).vi.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
    (demo->vertices).vi.pNext = (void *)0x0;
    (demo->vertices).vi.vertexBindingDescriptionCount = 1;
    (demo->vertices).vi.pVertexBindingDescriptions = (demo->vertices).vi_bindings;
    (demo->vertices).vi.vertexAttributeDescriptionCount = 2;
    (demo->vertices).vi.pVertexAttributeDescriptions = (demo->vertices).vi_attrs;
    (demo->vertices).vi_bindings[0].binding = 0;
    (demo->vertices).vi_bindings[0].stride = 0x14;
    *(undefined8 *)&(demo->vertices).vi_bindings[0].inputRate = 0;
    (demo->vertices).vi_attrs[1].binding = 0;
    (demo->vertices).vi_attrs[0].binding = 0;
    (demo->vertices).vi_attrs[0].format = VK_FORMAT_R32G32B32_SFLOAT;
    *(undefined8 *)&(demo->vertices).vi_attrs[0].offset = 0x100000000;
    (demo->vertices).vi_attrs[1].format = VK_FORMAT_R32G32_SFLOAT;
    (demo->vertices).vi_attrs[1].offset = 0xc;
    local_338.width = 0;
    local_338.height = 0;
    local_348 = (undefined1  [8])0x100000000;
    VStack_340.width = 1;
    VStack_340.height = 0x10;
    local_3b8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    local_3b8._8_8_ = (VkImage)0x0;
    local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
    local_3b8._20_4_ = 1;
    ppVVar2 = &demo->desc_layout;
    unique0x1000337e = (VkDescriptorSetLayoutBinding *)local_348;
    VVar14 = (*glad_vkCreateDescriptorSetLayout)
                       (demo->device,(VkDescriptorSetLayoutCreateInfo *)local_3b8,
                        (VkAllocationCallbacks *)0x0,ppVVar2);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x467,"void demo_prepare_descriptor_layout(struct demo *)");
    }
    local_298._0_4_ = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
    local_298._8_8_ = (void *)0x0;
    local_288 = (VkDescriptorSet)0x100000000;
    local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_REPEAT;
    uStack_270._0_4_ = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    uStack_270._4_4_ = 0.0;
    uStack_280 = (VkPipelineShaderStageCreateInfo *)ppVVar2;
    VVar14 = (*glad_vkCreatePipelineLayout)
                       (demo->device,(VkPipelineLayoutCreateInfo *)local_298,
                        (VkAllocationCallbacks *)0x0,&demo->pipeline_layout);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x472,"void demo_prepare_descriptor_layout(struct demo *)");
    }
    local_298._4_4_ = demo->format;
    local_298._0_4_ = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    local_298._8_8_ = (void *)0x100000001;
    local_288 = (VkDescriptorSet)0x200000000;
    uStack_280._0_4_ = VK_FILTER_LINEAR;
    uStack_280._4_4_ = 2;
    local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
    local_278._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
    uStack_270._0_4_ = (demo->depth).format;
    uStack_270._4_4_ = 1.4013e-45;
    VStack_268 = VK_SAMPLE_COUNT_1_BIT;
    fStack_264 = 1.4013e-45;
    uStack_260._0_4_ = 2;
    uStack_260._4_4_ = VK_SHARING_MODE_CONCURRENT;
    uStack_258._0_4_ = 4.2039e-45;
    uStack_258._4_4_ = 4.2039e-45;
    local_2d8.sType = 0;
    local_2d8._4_4_ = 2;
    uStack_388 = &local_208;
    local_208.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
    local_208._4_4_ = 3;
    local_3b8._0_8_ = (VkSampler)0x0;
    local_3b8._8_8_ = local_3b8._8_8_ & 0xffffffff00000000;
    local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
    local_3b8._20_4_ = 0;
    local_3b8._24_4_ = 1;
    local_398 = (VkExtent2D *)&local_2d8;
    auStack_390._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
    auStack_390._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
    VStack_380._0_8_ = VStack_380._0_8_ & 0xffffffff00000000;
    VStack_380.levelCount = 0;
    VStack_380.baseArrayLayer = 0;
    local_348._0_4_ = 0x26;
    VStack_340.width = 0;
    VStack_340.height = 0;
    local_338.width = 0;
    local_338.height = 2;
    local_328 = (char *)CONCAT44(local_328._4_4_,1);
    local_318 = (ulong)local_318._4_4_ << 0x20;
    pVStack_310 = (VkSubpassDependency *)0x0;
    local_350 = (VkImageView)ppVVar2;
    VStack_330 = (VkExtent2D)local_298;
    pVStack_320 = (VkSubpassDescription *)local_3b8;
    VVar14 = (*glad_vkCreateRenderPass)
                       (demo->device,(VkRenderPassCreateInfo *)local_348,
                        (VkAllocationCallbacks *)0x0,&demo->render_pass);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x4b0,"void demo_prepare_render_pass(struct demo *)");
    }
    local_1c8.pDynamicStates = local_f8;
    local_f8[0] = VK_DYNAMIC_STATE_VIEWPORT;
    local_f8[1] = VK_DYNAMIC_STATE_VIEWPORT;
    local_f8[2] = VK_DYNAMIC_STATE_VIEWPORT;
    local_f8[3] = VK_DYNAMIC_STATE_VIEWPORT;
    local_f8[4] = VK_DYNAMIC_STATE_VIEWPORT;
    local_f8[5] = VK_DYNAMIC_STATE_VIEWPORT;
    local_f8[6] = VK_DYNAMIC_STATE_VIEWPORT;
    local_f8[7] = VK_DYNAMIC_STATE_VIEWPORT;
    local_f8[8] = 0;
    local_1c8.pNext = (void *)0x0;
    local_1c8.flags = 0;
    local_1c8.dynamicStateCount = 0;
    local_1c8.sType = VK_STRUCTURE_TYPE_PIPELINE_DYNAMIC_STATE_CREATE_INFO;
    local_1c8._4_4_ = 0;
    memset(local_298,0,0x90);
    local_298._0_4_ = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
    local_230 = demo->pipeline_layout;
    local_188.sType = (demo->vertices).vi.sType;
    local_188._4_4_ = *(undefined4 *)&(demo->vertices).vi.field_0x4;
    local_188.pNext = (demo->vertices).vi.pNext;
    local_188.flags = (demo->vertices).vi.flags;
    local_188.vertexBindingDescriptionCount = (demo->vertices).vi.vertexBindingDescriptionCount;
    local_188.pVertexBindingDescriptions = (demo->vertices).vi.pVertexBindingDescriptions;
    local_188.vertexAttributeDescriptionCount = (demo->vertices).vi.vertexAttributeDescriptionCount;
    local_188._36_4_ = *(undefined4 *)&(demo->vertices).vi.field_0x24;
    local_188.pVertexAttributeDescriptions = (demo->vertices).vi.pVertexAttributeDescriptions;
    local_1a8.pNext = (void *)0x0;
    local_1a8.primitiveRestartEnable = 0;
    local_1a8._28_4_ = 0;
    local_1a8.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
    local_1a8._4_4_ = 0;
    local_1a8.flags = 0;
    local_1a8.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
    local_2d8.pNext = (void *)0x0;
    local_2d8.depthBiasEnable = 0;
    local_2d8.depthBiasConstantFactor = 0.0;
    local_2d8.depthBiasClamp = 0.0;
    local_2d8.depthBiasSlopeFactor = 0.0;
    local_2d8.flags = 0;
    local_2d8.depthClampEnable = 0;
    local_2d8.rasterizerDiscardEnable = 0;
    local_2d8.polygonMode = VK_POLYGON_MODE_FILL;
    local_2d8.sType = 0x17;
    local_2d8._4_4_ = 0;
    local_2d8.cullMode = 2;
    local_2d8.frontFace = VK_FRONT_FACE_CLOCKWISE;
    local_2d8._56_8_ = 0x3f800000;
    local_208.pNext = (void *)0x0;
    local_208.blendConstants[2] = 0.0;
    local_208.blendConstants[3] = 0.0;
    local_208.blendConstants[0] = 0.0;
    local_208.blendConstants[1] = 0.0;
    local_208.flags = 0;
    local_208.logicOpEnable = 0;
    local_208.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
    local_208._4_4_ = 0;
    local_208.pAttachments = &local_138;
    local_138.srcAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
    local_138.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
    local_138.blendEnable = 0;
    local_138.srcColorBlendFactor = VK_BLEND_FACTOR_ZERO;
    local_138.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
    local_138.colorBlendOp = VK_BLEND_OP_ADD;
    local_138.alphaBlendOp = VK_BLEND_OP_ADD;
    local_138.colorWriteMask = 0xf;
    local_208.logicOp = VK_LOGIC_OP_CLEAR;
    local_208.attachmentCount = 1;
    local_68.pScissors = (VkRect2D *)0x0;
    local_68.pViewports = (VkViewport *)0x0;
    local_68.pNext = (void *)0x0;
    local_68.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
    local_68._4_4_ = 0;
    local_68.flags = 0;
    local_68.viewportCount = 1;
    local_68.scissorCount = 1;
    local_68._36_4_ = 0;
    local_1c8.dynamicStateCount = 2;
    local_f8[0] = VK_DYNAMIC_STATE_VIEWPORT;
    local_f8[1] = VK_DYNAMIC_STATE_SCISSOR;
    local_358 = 0;
    uStack_364 = 0;
    uStack_360 = 0;
    uStack_35c = 0;
    VStack_380.baseArrayLayer = 0;
    VStack_380.layerCount = 0;
    local_36c = 0;
    local_398 = (VkExtent2D *)0x0;
    local_3b8._16_4_ = VK_IMAGE_LAYOUT_UNDEFINED;
    local_3b8._8_8_ = (VkImage)0x0;
    local_3b8._0_8_ = (VkSampler)0x19;
    local_3b8._20_4_ = 1;
    local_3b8._24_4_ = 1;
    uStack_39c = 3;
    local_368 = 7;
    auStack_390._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
    auStack_390._4_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
    VStack_380.aspectMask = 0;
    VStack_380.baseMipLevel = 0;
    VStack_380.levelCount = 0;
    uStack_388._0_4_ = VK_COMPONENT_SWIZZLE_IDENTITY;
    uStack_388._4_4_ = VK_COMPONENT_SWIZZLE_A|VK_COMPONENT_SWIZZLE_ZERO;
    local_98.pSampleMask = (VkSampleMask *)0x0;
    local_98.alphaToCoverageEnable = 0;
    local_98.alphaToOneEnable = 0;
    local_98.sampleShadingEnable = 0;
    local_98.minSampleShading = 0.0;
    local_98.pNext = (void *)0x0;
    local_98.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
    local_98._4_4_ = 0;
    local_98.flags = 0;
    local_98.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
    local_288 = (VkDescriptorSet)CONCAT44(2,(VkSwapchainCreateFlagsKHR)local_288);
    VStack_340.width = 0;
    VStack_340.height = 0;
    VStack_330.width = 0;
    VStack_330.height = 0;
    local_2f8 = (char *)0x0;
    uStack_2f0 = 0;
    local_308 = 0;
    pVStack_300 = (VkShaderModule)0x0;
    local_318._0_4_ = 0;
    local_318._4_4_ = 0;
    pVStack_310 = (VkSubpassDependency *)0x0;
    local_328 = (char *)0x0;
    pVStack_320 = (VkSubpassDescription *)0x0;
    local_348 = (undefined1  [8])0x12;
    local_338.width = 0;
    local_338.height = 1;
    VStack_330 = (VkExtent2D)demo_prepare_shader_module((demo *)demo->device,vertShaderCode,0x2f0);
    demo->vert_shader_module = (VkShaderModule)VStack_330;
    local_328 = "main";
    local_318._0_4_ = 0x12;
    local_308 = CONCAT44(0x10,(undefined4)local_308);
    pVStack_300 = demo_prepare_shader_module((demo *)demo->device,fragShaderCode,0x274);
    demo->frag_shader_module = pVStack_300;
    local_2f8 = "main";
    local_278 = (VkPipelineDepthStencilStateCreateInfo *)&local_188;
    uStack_270 = (VkPipelineShaderStageCreateInfo *)&local_1a8;
    uStack_258 = &local_2d8;
    uStack_240 = &local_208;
    local_228 = demo->render_pass;
    local_238 = &local_1c8;
    local_c8.pNext = (void *)0x0;
    local_c8.pInitialData = (void *)0x0;
    local_c8.flags = 0;
    local_c8._20_4_ = 0;
    local_c8.initialDataSize = 0;
    local_c8.sType = VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO;
    local_c8._4_4_ = 0;
    local_250 = &local_98;
    uStack_260 = &local_68;
    local_248 = (VkPipelineDepthStencilStateCreateInfo *)local_3b8;
    uStack_280 = (VkPipelineShaderStageCreateInfo *)local_348;
    VVar14 = (*glad_vkCreatePipelineCache)
                       (demo->device,&local_c8,(VkAllocationCallbacks *)0x0,&demo->pipelineCache);
    if (VVar14 != VK_SUCCESS) {
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x542,"void demo_prepare_pipeline(struct demo *)");
    }
    VVar14 = (*glad_vkCreateGraphicsPipelines)
                       (demo->device,demo->pipelineCache,1,(VkGraphicsPipelineCreateInfo *)local_298
                        ,(VkAllocationCallbacks *)0x0,&demo->pipeline);
    puVar1 = local_2e0;
    if (VVar14 == VK_SUCCESS) {
      (*glad_vkDestroyPipelineCache)(demo->device,demo->pipelineCache,(VkAllocationCallbacks *)0x0);
      (*glad_vkDestroyShaderModule)
                (demo->device,demo->frag_shader_module,(VkAllocationCallbacks *)0x0);
      (*glad_vkDestroyShaderModule)
                (demo->device,demo->vert_shader_module,(VkAllocationCallbacks *)0x0);
      local_3b8._0_8_ = (VkSampler)0x100000001;
      local_298._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO;
      local_298._8_8_ = (void *)0x0;
      local_288 = (VkDescriptorSet)0x100000000;
      uStack_280._0_4_ = VK_FILTER_LINEAR;
      local_278 = (VkPipelineDepthStencilStateCreateInfo *)local_3b8;
      VVar14 = (*glad_vkCreateDescriptorPool)
                         (demo->device,(VkDescriptorPoolCreateInfo *)local_298,
                          (VkAllocationCallbacks *)0x0,&demo->desc_pool);
      if (VVar14 != VK_SUCCESS) {
        __assert_fail("!err",
                      "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                      ,0x55d,"void demo_prepare_descriptor_pool(struct demo *)");
      }
      local_3b8._0_4_ = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
      local_3b8._8_8_ = (VkImage)0x0;
      local_3b8._16_4_ = SUB84(demo->desc_pool,0);
      local_3b8._20_4_ = (undefined4)((ulong)demo->desc_pool >> 0x20);
      local_3b8._24_4_ = 1;
      local_398 = (VkExtent2D *)local_350;
      VVar14 = (*glad_vkAllocateDescriptorSets)
                         (demo->device,(VkDescriptorSetAllocateInfo *)local_3b8,&demo->desc_set);
      if (VVar14 == VK_SUCCESS) {
        local_338.width = 1;
        local_338.height = 0;
        local_348 = (undefined1  [8])demo->textures[0].sampler;
        VStack_340 = (VkExtent2D)demo->textures[0].view;
        local_298._8_8_ = (void *)0x0;
        uStack_280._0_4_ = VK_FILTER_NEAREST;
        uStack_280._4_4_ = VK_SAMPLER_MIPMAP_MODE_NEAREST;
        VStack_268 = 0;
        fStack_264 = 0.0;
        uStack_260._0_4_ = 0;
        uStack_260._4_4_ = VK_SHARING_MODE_EXCLUSIVE;
        local_298._0_4_ = VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET;
        local_298._4_4_ = 0;
        local_288 = demo->desc_set;
        local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_MIRRORED_REPEAT;
        local_278._4_4_ = VK_SHARING_MODE_CONCURRENT;
        uStack_270 = (VkPipelineShaderStageCreateInfo *)local_348;
        (*glad_vkUpdateDescriptorSets)
                  (demo->device,1,(VkWriteDescriptorSet *)local_298,0,(VkCopyDescriptorSet *)0x0);
        local_3b8._8_8_ = (demo->depth).view;
        local_298._0_4_ = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
        local_298._8_8_ = (void *)0x0;
        local_288 = (VkDescriptorSet)((ulong)local_288 & 0xffffffff00000000);
        uStack_280._0_4_ = (VkFilter)demo->render_pass;
        uStack_280._4_4_ = (VkSamplerMipmapMode)((ulong)demo->render_pass >> 0x20);
        local_278._0_4_ = VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE;
        uVar8 = demo->width;
        uVar13 = demo->height;
        uStack_260._0_4_ = 1;
        uVar5 = demo->swapchainImageCount;
        VStack_268 = uVar8;
        fStack_264 = (float)uVar13;
        uStack_270 = (VkPipelineShaderStageCreateInfo *)local_3b8;
        ppVVar18 = (VkFramebuffer *)malloc((ulong)uVar5 * 8);
        demo->framebuffers = ppVVar18;
        if (ppVVar18 == (VkFramebuffer *)0x0) {
          __assert_fail("demo->framebuffers",
                        "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                        ,0x593,"void demo_prepare_framebuffers(struct demo *)");
        }
        if (uVar5 != 0) {
          lVar23 = 2;
          lVar20 = 0;
          uVar24 = 0;
          do {
            local_3b8._0_8_ = (&demo->buffers->image)[lVar23];
            VVar14 = (*glad_vkCreateFramebuffer)
                               (demo->device,(VkFramebufferCreateInfo *)local_298,
                                (VkAllocationCallbacks *)0x0,
                                (VkFramebuffer *)((long)demo->framebuffers + lVar20));
            if (VVar14 != VK_SUCCESS) {
              __assert_fail("!err",
                            "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                            ,0x599,"void demo_prepare_framebuffers(struct demo *)");
            }
            uVar24 = uVar24 + 1;
            lVar20 = lVar20 + 8;
            lVar23 = lVar23 + 3;
          } while (uVar24 < *puVar1);
        }
        return;
      }
      __assert_fail("!err",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                    ,0x56d,"void demo_prepare_descriptor_set(struct demo *)");
    }
    __assert_fail("!err",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/tests/triangle-vulkan.c"
                  ,0x545,"void demo_prepare_pipeline(struct demo *)");
  }
  goto LAB_0010aa68;
}

Assistant:

static void demo_prepare(struct demo *demo) {
    VkResult U_ASSERT_ONLY err;

    const VkCommandPoolCreateInfo cmd_pool_info = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,
        .pNext = NULL,
        .queueFamilyIndex = demo->graphics_queue_node_index,
        .flags = VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,
    };
    err = vkCreateCommandPool(demo->device, &cmd_pool_info, NULL,
                              &demo->cmd_pool);
    assert(!err);

    const VkCommandBufferAllocateInfo cmd = {
        .sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,
        .pNext = NULL,
        .commandPool = demo->cmd_pool,
        .level = VK_COMMAND_BUFFER_LEVEL_PRIMARY,
        .commandBufferCount = 1,
    };
    err = vkAllocateCommandBuffers(demo->device, &cmd, &demo->draw_cmd);
    assert(!err);

    demo_prepare_buffers(demo);
    demo_prepare_depth(demo);
    demo_prepare_textures(demo);
    demo_prepare_vertices(demo);
    demo_prepare_descriptor_layout(demo);
    demo_prepare_render_pass(demo);
    demo_prepare_pipeline(demo);

    demo_prepare_descriptor_pool(demo);
    demo_prepare_descriptor_set(demo);

    demo_prepare_framebuffers(demo);
}